

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void svd_sort(double *U,int M,int N,double *V,double *q)

{
  size_t __size;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  int *pos;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  lVar3 = (long)N;
  __size = lVar3 * 8;
  __ptr = malloc((long)M * __size);
  __ptr_00 = malloc(__size * lVar3);
  __ptr_01 = malloc(__size);
  pos = (int *)malloc(lVar3 * 4);
  uVar1 = 0;
  uVar4 = 0;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    *(double *)((long)__ptr_01 + uVar1 * 8) = q[uVar1];
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)(N * M);
  if (N * M < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    *(double *)((long)__ptr + uVar2 * 8) = U[uVar2];
  }
  for (uVar1 = 0; (uint)(N * N) != uVar1; uVar1 = uVar1 + 1) {
    *(double *)((long)__ptr_00 + uVar1 * 8) = V[uVar1];
  }
  sort1d(q,N,pos);
  uVar2 = 0;
  uVar1 = (ulong)(uint)M;
  if (M < 1) {
    uVar1 = uVar2;
  }
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    lVar3 = (long)pos[uVar2];
    q[uVar2] = *(double *)((long)__ptr_01 + lVar3 * 8);
    lVar6 = 0;
    uVar5 = uVar1;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      *(undefined8 *)((long)U + lVar6) = *(undefined8 *)((long)__ptr + lVar6 + lVar3 * 8);
      lVar6 = lVar6 + __size;
    }
    lVar6 = 0;
    uVar5 = (ulong)(uint)N;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      *(undefined8 *)((long)V + lVar6) = *(undefined8 *)((long)__ptr_00 + lVar6 + lVar3 * 8);
      lVar6 = lVar6 + __size;
    }
    U = U + 1;
    V = V + 1;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(pos);
  return;
}

Assistant:

void svd_sort(double *U,int M,int N,double *V,double *q) {
	/*
	 * Pavel Sakov's CSA SVD sort routine is used with some minor
	 * modifications. See The License below
	 */
	/*
	 * Copyright (C) 2000-2008 Pavel Sakov and CSIRO

Redistribution and use of material from the package `csa', with or without
modification, are permitted provided that the following conditions are
met:

1. Redistributions of material must retain the above copyright notice, this
list of conditions and the following disclaimer.
2. The names of the authors may not be used to endorse or promote products
derived from this software without specific prior written permission.

THIS SOFTWARE IS PROVIDED BY THE AUTHORS ``AS IS'' AND ANY EXPRESS OR IMPLIED
WARRANTIES, INCLUDING, BUT NOT LIMITED TO, THE IMPLIED WARRANTIES OF
MERCHANTABILITY AND FITNESS FOR A PARTICULAR PURPOSE ARE DISCLAIMED. IN NO
EVENT SHALL THE AUTHORS BE LIABLE FOR ANY DIRECT, INDIRECT, INCIDENTAL, SPECIAL,
EXEMPLARY, OR CONSEQUENTIAL DAMAGES (INCLUDING, BUT NOT LIMITED TO, PROCUREMENT
OF SUBSTITUTE GOODS OR SERVICES; LOSS OF USE, DATA, OR PROFITS; OR BUSINESS
INTERRUPTION) HOWEVER CAUSED AND ON ANY THEORY OF LIABILITY, WHETHER IN
CONTRACT, STRICT LIABILITY, OR TORT (INCLUDING NEGLIGENCE OR OTHERWISE) ARISING
IN ANY WAY OUT OF THE USE OF THIS SOFTWARE, EVEN IF ADVISED OF THE POSSIBILITY
OF SUCH DAMAGE.
	 */
	int i,j;
	double *UT,*VT,*qq;
	int *pos;

	UT = (double*) malloc(sizeof(double) * N * M);
	VT = (double*) malloc(sizeof(double) * N * N);
	qq = (double*) malloc(sizeof(double) * N);
	pos = (int*) malloc(sizeof(int) * N);

	for(i = 0;i < N;++i) {
		qq[i] = q[i];
	}

	for(i = 0;i < M*N;++i) {
		UT[i] = U[i];
	}

	for(i = 0;i < N*N;++i) {
		VT[i] = V[i];
	}

	//mtranspose(U,M,N,UT);
	//mtranspose(V,N,N,VT);

	sort1d(q,N,pos);

	for(i = 0; i < N;++i) {
		q[i] = qq[pos[i]];

		for (j = 0; j < M;++j) {
			U[j*N+i] = UT[j*N+pos[i]];
		}
		for (j = 0; j < N;++j) {
			V[j*N+i] = VT[j*N+pos[i]];
		}
	}

	free(UT);
	free(VT);
	free(qq);
	free(pos);

}